

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

handle pybind11::detail::get_object_handle(void *ptr,type_info *type)

{
  internals *piVar1;
  _Node_iterator_base<std::pair<const_void_*const,_void_*>,_false> _Var2;
  type_info *ptVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_void_*>,_false,_false>_>
  pVar4;
  void *local_28;
  
  local_28 = ptr;
  piVar1 = get_internals();
  pVar4 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(piVar1->registered_instances)._M_h,&local_28);
  _Var2._M_cur = (__node_type *)
                 pVar4.first.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>.
                 _M_cur;
  while( true ) {
    if ((_Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>)_Var2._M_cur ==
        pVar4.second.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur.
        super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>) {
      return (handle)(PyObject *)0x0;
    }
    ptVar3 = get_type_info(*(PyTypeObject **)
                            (*(long *)((long)&((_Var2._M_cur)->
                                              super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>
                                              ).
                                              super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>
                                              ._M_storage._M_storage + 8) + 8));
    if (ptVar3 == type && ptVar3 != (type_info *)0x0) break;
    _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt;
  }
  return (handle)*(PyObject **)
                  ((long)&((_Var2._M_cur)->
                          super__Hash_node_value<std::pair<const_void_*const,_void_*>,_false>).
                          super__Hash_node_value_base<std::pair<const_void_*const,_void_*>_>.
                          _M_storage._M_storage + 8);
}

Assistant:

PYBIND11_NOINLINE inline handle get_object_handle(const void *ptr, const detail::type_info *type ) {
    auto &instances = get_internals().registered_instances;
    auto range = instances.equal_range(ptr);
    for (auto it = range.first; it != range.second; ++it) {
        auto instance_type = detail::get_type_info(Py_TYPE(it->second));
        if (instance_type && instance_type == type)
            return handle((PyObject *) it->second);
    }
    return handle();
}